

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPathLabel.cxx
# Opt level: O0

void __thiscall cmPathLabel::cmPathLabel(cmPathLabel *this,string *label)

{
  bool bVar1;
  reference pcVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_30;
  char i;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  string *label_local;
  cmPathLabel *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)label);
  this->Hash = 0;
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _Stack_30._M_current = (char *)std::__cxx11::string::end();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffd0);
    if (!bVar1) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    this->Hash = (int)*pcVar2 + this->Hash;
    this->Hash = this->Hash * 0x400 + this->Hash;
    this->Hash = this->Hash >> 6 ^ this->Hash;
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  this->Hash = this->Hash * 8 + this->Hash;
  this->Hash = this->Hash >> 0xb ^ this->Hash;
  this->Hash = this->Hash * 0x8000 + this->Hash;
  return;
}

Assistant:

cmPathLabel::cmPathLabel(std::string label)
  : Label(std::move(label))
  , Hash(0)
{
  // Use a Jenkins one-at-a-time hash with under/over-flow protection
  for (char i : this->Label) {
    this->Hash += i;
    this->Hash += ((this->Hash & 0x003FFFFF) << 10);
    this->Hash ^= ((this->Hash & 0xFFFFFFC0) >> 6);
  }
  this->Hash += ((this->Hash & 0x1FFFFFFF) << 3);
  this->Hash ^= ((this->Hash & 0xFFFFF800) >> 11);
  this->Hash += ((this->Hash & 0x0001FFFF) << 15);
}